

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
::insert(SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
         *this,GenericFunctionInstanceTypeRequest *key,GenericFunctionInstanceTypeResponse *value)

{
  uint uVar1;
  TypeBase *pTVar2;
  FunctionData *pFVar3;
  TypeHandle *pTVar4;
  MatchData *pMVar5;
  undefined4 uVar6;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  char *__assertion;
  int iVar10;
  Node *this_00;
  GenericFunctionInstanceTypeRequest local_68;
  
  local_68.hash = 0;
  local_68.parentType = (TypeBase *)0x0;
  local_68.function = (FunctionData *)0x0;
  local_68.arguments.head = (TypeHandle *)0x0;
  local_68.arguments.tail = (TypeHandle *)0x0;
  local_68.aliases.head = (MatchData *)0x0;
  local_68.aliases.tail = (MatchData *)0x0;
  bVar7 = GenericFunctionInstanceTypeRequest::operator!=(key,&local_68);
  if (bVar7) {
    uVar8 = this->bucketCount;
    if (uVar8 <= (this->count >> 2) + this->count) {
      rehash(this);
      uVar8 = this->bucketCount;
    }
    uVar1 = uVar8 - 1;
    uVar9 = key->hash;
    for (iVar10 = 1; iVar10 - 1U < uVar8; iVar10 = iVar10 + 1) {
      uVar9 = uVar9 & uVar1;
      this_00 = this->data + uVar9;
      local_68.hash = 0;
      local_68.aliases.head = (MatchData *)0x0;
      local_68.aliases.tail = (MatchData *)0x0;
      local_68.arguments.head = (TypeHandle *)0x0;
      local_68.arguments.tail = (TypeHandle *)0x0;
      local_68.parentType = (TypeBase *)0x0;
      local_68.function = (FunctionData *)0x0;
      bVar7 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,&local_68);
      if (bVar7) {
        (this_00->key).aliases.tail = (key->aliases).tail;
        uVar8 = key->hash;
        uVar6 = *(undefined4 *)&key->field_0x4;
        pTVar2 = key->parentType;
        pFVar3 = key->function;
        pTVar4 = (key->arguments).head;
        pMVar5 = (key->aliases).head;
        (this_00->key).arguments.tail = (key->arguments).tail;
        (this_00->key).aliases.head = pMVar5;
        (this_00->key).function = pFVar3;
        (this_00->key).arguments.head = pTVar4;
        (this_00->key).hash = uVar8;
        *(undefined4 *)&(this_00->key).field_0x4 = uVar6;
        (this_00->key).parentType = pTVar2;
        pMVar5 = (value->aliases).head;
        (this_00->value).functionType = value->functionType;
        (this_00->value).aliases.head = pMVar5;
        (this_00->value).aliases.tail = (value->aliases).tail;
        this->count = this->count + 1;
        return;
      }
      bVar7 = GenericFunctionInstanceTypeRequest::operator==(&this_00->key,key);
      if (bVar7) {
        (this_00->value).aliases.tail = (value->aliases).tail;
        pMVar5 = (value->aliases).head;
        (this_00->value).functionType = value->functionType;
        (this_00->value).aliases.head = pMVar5;
        return;
      }
      uVar9 = uVar9 + iVar10;
      uVar8 = this->bucketCount;
    }
    __assertion = "!\"couldn\'t insert node\"";
    uVar8 = 0x5b;
  }
  else {
    __assertion = "key != Key()";
    uVar8 = 0x3b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,uVar8,
                "void SmallDenseMap<GenericFunctionInstanceTypeRequest, GenericFunctionInstanceTypeResponse, GenericFunctionInstanceTypeRequestHasher, 32>::insert(const Key &, const Value &) [Key = GenericFunctionInstanceTypeRequest, Value = GenericFunctionInstanceTypeResponse, Hasher = GenericFunctionInstanceTypeRequestHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key, const Value& value)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
			{
				item.key = key;
				item.value = value;

				count++;
				return;
			}

			if(item.key == key)
			{
				item.value = value;
				return;
			}

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}